

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Type TVar4;
  uint uVar5;
  long lVar6;
  
  bVar2 = InRealOneof(this,field);
  if (bVar2) {
    if (((byte)field[1] & 0x10) == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)(field + 0x28);
    }
    uVar1 = this->offsets_
            [(long)*(int *)(*(long *)(field + 0x20) + 4) +
             (long)(int)((lVar6 - *(long *)(*(long *)(lVar6 + 0x10) + 0x30)) / 0x28)];
    TVar4 = FieldDescriptor::type(field);
    uVar5 = 0x7fffffff;
    if (TVar4 - TYPE_STRING < 4) {
      uVar5 = *(uint *)(&DAT_0042d070 + (ulong)(TVar4 - TYPE_STRING) * 4);
    }
    return uVar5 & uVar1;
  }
  uVar3 = GetFieldOffsetNonOneof(this,field);
  return uVar3;
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }